

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O2

void glfwGetMonitorPhysicalSize(GLFWmonitor *handle,int *widthMM,int *heightMM)

{
  _GLFWmonitor *monitor;
  
  if (handle == (GLFWmonitor *)0x0) {
    __assert_fail("monitor != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/src/monitor.c"
                  ,0x14e,"void glfwGetMonitorPhysicalSize(GLFWmonitor *, int *, int *)");
  }
  if (widthMM != (int *)0x0) {
    *widthMM = 0;
  }
  if (heightMM != (int *)0x0) {
    *heightMM = 0;
  }
  if (_glfw.initialized != 0) {
    if (widthMM != (int *)0x0) {
      *widthMM = *(int *)(handle + 0x10);
    }
    if (heightMM != (int *)0x0) {
      *heightMM = *(int *)(handle + 0x14);
    }
    return;
  }
  _glfwInputError(0x10001,(char *)0x0);
  return;
}

Assistant:

GLFWAPI void glfwGetMonitorPhysicalSize(GLFWmonitor* handle, int* widthMM, int* heightMM)
{
    _GLFWmonitor* monitor = (_GLFWmonitor*) handle;
    assert(monitor != NULL);

    if (widthMM)
        *widthMM = 0;
    if (heightMM)
        *heightMM = 0;

    _GLFW_REQUIRE_INIT();

    if (widthMM)
        *widthMM = monitor->widthMM;
    if (heightMM)
        *heightMM = monitor->heightMM;
}